

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__tga_test(stbi__context *s)

{
  stbi_uc sVar1;
  int iVar2;
  stbi_uc *psVar3;
  stbi_uc *psVar4;
  byte bVar5;
  uint uVar6;
  stbi_uc *psVar7;
  
  psVar3 = s->img_buffer;
  psVar7 = s->img_buffer_end;
  if (psVar3 < psVar7) {
LAB_0011223b:
    psVar3 = psVar3 + 1;
    s->img_buffer = psVar3;
  }
  else if (s->read_from_callbacks != 0) {
    iVar2 = (*(s->io).read)(s->io_user_data,(char *)s->buffer_start,s->buflen);
    if (iVar2 == 0) {
      s->read_from_callbacks = 0;
      psVar7 = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
    }
    else {
      psVar7 = s->buffer_start + iVar2;
    }
    s->img_buffer_end = psVar7;
    psVar3 = s->buffer_start;
    goto LAB_0011223b;
  }
  if (psVar3 < psVar7) {
    psVar4 = psVar3 + 1;
    s->img_buffer = psVar4;
    bVar5 = *psVar3;
LAB_001122a2:
    psVar3 = psVar4;
    if (1 < bVar5) {
      return 0;
    }
  }
  else if (s->read_from_callbacks != 0) {
    psVar3 = s->buffer_start;
    iVar2 = (*(s->io).read)(s->io_user_data,(char *)psVar3,s->buflen);
    if (iVar2 == 0) {
      s->read_from_callbacks = 0;
      psVar7 = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
      bVar5 = 0;
    }
    else {
      psVar7 = psVar3 + iVar2;
      bVar5 = *psVar3;
    }
    s->img_buffer_end = psVar7;
    psVar4 = s->buffer_start + 1;
    s->img_buffer = psVar4;
    goto LAB_001122a2;
  }
  if (psVar3 < psVar7) {
    s->img_buffer = psVar3 + 1;
    bVar5 = *psVar3;
  }
  else {
    if (s->read_from_callbacks == 0) {
      return 0;
    }
    psVar7 = s->buffer_start;
    iVar2 = (*(s->io).read)(s->io_user_data,(char *)psVar7,s->buflen);
    if (iVar2 == 0) {
      s->read_from_callbacks = 0;
      psVar3 = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
      bVar5 = 0;
    }
    else {
      psVar3 = psVar7 + iVar2;
      bVar5 = *psVar7;
    }
    s->img_buffer_end = psVar3;
    s->img_buffer = s->buffer_start + 1;
  }
  uVar6 = 0;
  if ((byte)((bVar5 & 0xf7) - 4) < 0xfd) {
    return 0;
  }
  stbi__get16be(s);
  stbi__get16be(s);
  psVar7 = s->img_buffer;
  if (s->img_buffer_end <= psVar7) {
    if (s->read_from_callbacks == 0) goto LAB_00112381;
    iVar2 = (*(s->io).read)(s->io_user_data,(char *)s->buffer_start,s->buflen);
    if (iVar2 == 0) {
      s->read_from_callbacks = 0;
      psVar7 = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
    }
    else {
      psVar7 = s->buffer_start + iVar2;
    }
    s->img_buffer_end = psVar7;
    psVar7 = s->buffer_start;
  }
  s->img_buffer = psVar7 + 1;
LAB_00112381:
  stbi__get16be(s);
  stbi__get16be(s);
  iVar2 = stbi__get16be(s);
  if ((iVar2 != 0) && (iVar2 = stbi__get16be(s), iVar2 != 0)) {
    psVar7 = s->img_buffer;
    if (psVar7 < s->img_buffer_end) {
      s->img_buffer = psVar7 + 1;
      sVar1 = *psVar7;
    }
    else if (s->read_from_callbacks == 0) {
      sVar1 = '\0';
    }
    else {
      psVar7 = s->buffer_start;
      iVar2 = (*(s->io).read)(s->io_user_data,(char *)psVar7,s->buflen);
      if (iVar2 == 0) {
        s->read_from_callbacks = 0;
        psVar3 = s->buffer_start + 1;
        s->buffer_start[0] = '\0';
        sVar1 = '\0';
      }
      else {
        psVar3 = psVar7 + iVar2;
        sVar1 = *psVar7;
      }
      s->img_buffer_end = psVar3;
    }
    uVar6 = (uint)((sVar1 - 8 & 0xe7) == 0);
    s->img_buffer = s->img_buffer_original;
  }
  return uVar6;
}

Assistant:

static int stbi__tga_test(stbi__context *s)
{
   int res;
   int sz;
   stbi__get8(s);      //   discard Offset
   sz = stbi__get8(s);   //   color type
   if ( sz > 1 ) return 0;   //   only RGB or indexed allowed
   sz = stbi__get8(s);   //   image type
   if ( (sz != 1) && (sz != 2) && (sz != 3) && (sz != 9) && (sz != 10) && (sz != 11) ) return 0;   //   only RGB or grey allowed, +/- RLE
   stbi__get16be(s);      //   discard palette start
   stbi__get16be(s);      //   discard palette length
   stbi__get8(s);         //   discard bits per palette color entry
   stbi__get16be(s);      //   discard x origin
   stbi__get16be(s);      //   discard y origin
   if ( stbi__get16be(s) < 1 ) return 0;      //   test width
   if ( stbi__get16be(s) < 1 ) return 0;      //   test height
   sz = stbi__get8(s);   //   bits per pixel
   if ( (sz != 8) && (sz != 16) && (sz != 24) && (sz != 32) )
      res = 0;
   else
      res = 1;
   stbi__rewind(s);
   return res;
}